

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct64_stage4_high32_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar12._8_4_ = 0x191f014;
  auVar12._0_8_ = 0x191f0140191f014;
  auVar12._12_4_ = 0x191f014;
  auVar12._16_4_ = 0x191f014;
  auVar12._20_4_ = 0x191f014;
  auVar12._24_4_ = 0x191f014;
  auVar12._28_4_ = 0x191f014;
  auVar8._8_4_ = 0xfec0191;
  auVar8._0_8_ = 0xfec01910fec0191;
  auVar8._12_4_ = 0xfec0191;
  auVar8._16_4_ = 0xfec0191;
  auVar8._20_4_ = 0xfec0191;
  auVar8._24_4_ = 0xfec0191;
  auVar8._28_4_ = 0xfec0191;
  auVar6._8_4_ = 0xf014fe6f;
  auVar6._0_8_ = 0xf014fe6ff014fe6f;
  auVar6._12_4_ = 0xf014fe6f;
  auVar6._16_4_ = 0xf014fe6f;
  auVar6._20_4_ = 0xf014fe6f;
  auVar6._24_4_ = 0xf014fe6f;
  auVar6._28_4_ = 0xf014fe6f;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x21],(undefined1  [32])x[0x3e]);
  auVar7 = vpunpckhwd_avx2((undefined1  [32])x[0x21],(undefined1  [32])x[0x3e]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar12);
  auVar17 = vpmaddwd_avx2(auVar17,auVar8);
  auVar8 = vpmaddwd_avx2(auVar7,auVar8);
  auVar7 = vpmaddwd_avx2(auVar7,auVar12);
  auVar3 = in_ZMM0._0_32_;
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar14 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar14,auVar11);
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar17 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar17,auVar11);
  x[0x21] = alVar1;
  x[0x3e] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x22],(undefined1  [32])x[0x3d]);
  auVar8 = vpunpckhwd_avx2((undefined1  [32])x[0x22],(undefined1  [32])x[0x3d]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar6);
  auVar7 = vpmaddwd_avx2(auVar8,auVar6);
  auVar17 = vpmaddwd_avx2(auVar17,auVar12);
  auVar8 = vpmaddwd_avx2(auVar8,auVar12);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar11 = vpsrad_avx2(auVar11,0xc);
  auVar7 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar11,auVar7);
  auVar14._8_4_ = 0xc5ef5da;
  auVar14._0_8_ = 0xc5ef5da0c5ef5da;
  auVar14._12_4_ = 0xc5ef5da;
  auVar14._16_4_ = 0xc5ef5da;
  auVar14._20_4_ = 0xc5ef5da;
  auVar14._24_4_ = 0xc5ef5da;
  auVar14._28_4_ = 0xc5ef5da;
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar17 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar17,auVar11);
  auVar16._8_4_ = 0xa260c5e;
  auVar16._0_8_ = 0xa260c5e0a260c5e;
  auVar16._12_4_ = 0xa260c5e;
  auVar16._16_4_ = 0xa260c5e;
  auVar16._20_4_ = 0xa260c5e;
  auVar16._24_4_ = 0xa260c5e;
  auVar16._28_4_ = 0xa260c5e;
  x[0x22] = alVar1;
  x[0x3d] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x25],(undefined1  [32])x[0x3a]);
  auVar7 = vpunpckhwd_avx2((undefined1  [32])x[0x25],(undefined1  [32])x[0x3a]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar14);
  auVar17 = vpmaddwd_avx2(auVar17,auVar16);
  auVar8 = vpmaddwd_avx2(auVar7,auVar16);
  auVar7 = vpmaddwd_avx2(auVar7,auVar14);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar12 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar12,auVar11);
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar11 = vpsrad_avx2(auVar11,0xc);
  auVar7 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar11,auVar7);
  auVar7._8_4_ = 0xf5daf3a2;
  auVar7._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar7._12_4_ = 0xf5daf3a2;
  auVar7._16_4_ = 0xf5daf3a2;
  auVar7._20_4_ = 0xf5daf3a2;
  auVar7._24_4_ = 0xf5daf3a2;
  auVar7._28_4_ = 0xf5daf3a2;
  x[0x25] = alVar1;
  x[0x3a] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x26],(undefined1  [32])x[0x39]);
  auVar8 = vpunpckhwd_avx2((undefined1  [32])x[0x26],(undefined1  [32])x[0x39]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar7);
  auVar7 = vpmaddwd_avx2(auVar8,auVar7);
  auVar17 = vpmaddwd_avx2(auVar17,auVar14);
  auVar8 = vpmaddwd_avx2(auVar8,auVar14);
  auVar4._8_4_ = 0x78bf1e4;
  auVar4._0_8_ = 0x78bf1e4078bf1e4;
  auVar4._12_4_ = 0x78bf1e4;
  auVar4._16_4_ = 0x78bf1e4;
  auVar4._20_4_ = 0x78bf1e4;
  auVar4._24_4_ = 0x78bf1e4;
  auVar4._28_4_ = 0x78bf1e4;
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar11 = vpsrad_avx2(auVar11,0xc);
  auVar7 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar11,auVar7);
  auVar15._8_4_ = 0xe1c078b;
  auVar15._0_8_ = 0xe1c078b0e1c078b;
  auVar15._12_4_ = 0xe1c078b;
  auVar15._16_4_ = 0xe1c078b;
  auVar15._20_4_ = 0xe1c078b;
  auVar15._24_4_ = 0xe1c078b;
  auVar15._28_4_ = 0xe1c078b;
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar17 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar17,auVar11);
  x[0x26] = alVar1;
  x[0x39] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x29],(undefined1  [32])x[0x36]);
  auVar7 = vpunpckhwd_avx2((undefined1  [32])x[0x29],(undefined1  [32])x[0x36]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar4);
  auVar17 = vpmaddwd_avx2(auVar17,auVar15);
  auVar8 = vpmaddwd_avx2(auVar7,auVar15);
  auVar7 = vpmaddwd_avx2(auVar7,auVar4);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar12 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar12,auVar11);
  auVar9._8_4_ = 0xf1e4f875;
  auVar9._0_8_ = 0xf1e4f875f1e4f875;
  auVar9._12_4_ = 0xf1e4f875;
  auVar9._16_4_ = 0xf1e4f875;
  auVar9._20_4_ = 0xf1e4f875;
  auVar9._24_4_ = 0xf1e4f875;
  auVar9._28_4_ = 0xf1e4f875;
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar11 = vpsrad_avx2(auVar11,0xc);
  auVar7 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar11,auVar7);
  x[0x29] = alVar1;
  x[0x36] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x2a],(undefined1  [32])x[0x35]);
  auVar8 = vpunpckhwd_avx2((undefined1  [32])x[0x2a],(undefined1  [32])x[0x35]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar9);
  auVar7 = vpmaddwd_avx2(auVar8,auVar9);
  auVar17 = vpmaddwd_avx2(auVar17,auVar4);
  auVar8 = vpmaddwd_avx2(auVar8,auVar4);
  auVar5._8_4_ = 0xf50fb5b;
  auVar5._0_8_ = 0xf50fb5b0f50fb5b;
  auVar5._12_4_ = 0xf50fb5b;
  auVar5._16_4_ = 0xf50fb5b;
  auVar5._20_4_ = 0xf50fb5b;
  auVar5._24_4_ = 0xf50fb5b;
  auVar5._28_4_ = 0xf50fb5b;
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar12 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar12,auVar11);
  auVar13._8_4_ = 0x4a50f50;
  auVar13._0_8_ = 0x4a50f5004a50f50;
  auVar13._12_4_ = 0x4a50f50;
  auVar13._16_4_ = 0x4a50f50;
  auVar13._20_4_ = 0x4a50f50;
  auVar13._24_4_ = 0x4a50f50;
  auVar13._28_4_ = 0x4a50f50;
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar17 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar17,auVar11);
  x[0x2a] = alVar1;
  x[0x35] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x2d],(undefined1  [32])x[0x32]);
  auVar7 = vpunpckhwd_avx2((undefined1  [32])x[0x2d],(undefined1  [32])x[0x32]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar5);
  auVar17 = vpmaddwd_avx2(auVar17,auVar13);
  auVar8 = vpmaddwd_avx2(auVar7,auVar13);
  auVar7 = vpmaddwd_avx2(auVar7,auVar5);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar12 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar12,auVar11);
  auVar10._8_4_ = 0xfb5bf0b0;
  auVar10._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar10._12_4_ = 0xfb5bf0b0;
  auVar10._16_4_ = 0xfb5bf0b0;
  auVar10._20_4_ = 0xfb5bf0b0;
  auVar10._24_4_ = 0xfb5bf0b0;
  auVar10._28_4_ = 0xfb5bf0b0;
  auVar11 = vpaddd_avx2(auVar17,auVar3);
  auVar7 = vpaddd_avx2(auVar8,auVar3);
  auVar17 = vpsrad_avx2(auVar11,0xc);
  auVar11 = vpsrad_avx2(auVar7,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar17,auVar11);
  x[0x2d] = alVar1;
  x[0x32] = alVar2;
  auVar17 = vpunpcklwd_avx2((undefined1  [32])x[0x2e],(undefined1  [32])x[0x31]);
  auVar8 = vpunpckhwd_avx2((undefined1  [32])x[0x2e],(undefined1  [32])x[0x31]);
  auVar11 = vpmaddwd_avx2(auVar17,auVar10);
  auVar7 = vpmaddwd_avx2(auVar8,auVar10);
  auVar17 = vpmaddwd_avx2(auVar17,auVar5);
  auVar8 = vpmaddwd_avx2(auVar8,auVar5);
  auVar11 = vpaddd_avx2(auVar11,auVar3);
  auVar7 = vpaddd_avx2(auVar7,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar3);
  auVar8 = vpaddd_avx2(auVar8,auVar3);
  auVar11 = vpsrad_avx2(auVar11,0xc);
  auVar7 = vpsrad_avx2(auVar7,0xc);
  alVar1 = (__m256i)vpackssdw_avx2(auVar11,auVar7);
  auVar7 = vpsrad_avx2(auVar17,0xc);
  auVar11 = vpsrad_avx2(auVar8,0xc);
  alVar2 = (__m256i)vpackssdw_avx2(auVar7,auVar11);
  x[0x2e] = alVar1;
  x[0x31] = alVar2;
  return;
}

Assistant:

static inline void idct64_stage4_high32_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  const __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  const __m256i cospi_m60_m04 = pair_set_w16_epi16(-cospi[60], -cospi[4]);
  const __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  const __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  const __m256i cospi_m28_m36 = pair_set_w16_epi16(-cospi[28], -cospi[36]);
  const __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  const __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  const __m256i cospi_m44_m20 = pair_set_w16_epi16(-cospi[44], -cospi[20]);
  const __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  const __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  const __m256i cospi_m12_m52 = pair_set_w16_epi16(-cospi[12], -cospi[52]);
  btf_16_w16_avx2(cospi_m04_p60, cospi_p60_p04, &x[33], &x[62], _r, cos_bit);
  btf_16_w16_avx2(cospi_m60_m04, cospi_m04_p60, &x[34], &x[61], _r, cos_bit);
  btf_16_w16_avx2(cospi_m36_p28, cospi_p28_p36, &x[37], &x[58], _r, cos_bit);
  btf_16_w16_avx2(cospi_m28_m36, cospi_m36_p28, &x[38], &x[57], _r, cos_bit);
  btf_16_w16_avx2(cospi_m20_p44, cospi_p44_p20, &x[41], &x[54], _r, cos_bit);
  btf_16_w16_avx2(cospi_m44_m20, cospi_m20_p44, &x[42], &x[53], _r, cos_bit);
  btf_16_w16_avx2(cospi_m52_p12, cospi_p12_p52, &x[45], &x[50], _r, cos_bit);
  btf_16_w16_avx2(cospi_m12_m52, cospi_m52_p12, &x[46], &x[49], _r, cos_bit);
}